

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

BoundSheet * Excel::Parser::parseBoundSheet(Record *record,BiffVersion ver)

{
  SheetType SVar1;
  Record *in_RSI;
  BoundSheet *in_RDI;
  wstring sheetName;
  int16_t sheetType;
  int32_t pos;
  BiffVersion in_stack_000000c8;
  int32_t in_stack_000000cc;
  vector<int,_std::allocator<int>_> *in_stack_000000d0;
  Stream *in_stack_000000d8;
  wstring *this;
  undefined4 uVar2;
  wstring local_70 [48];
  wstring local_40 [4];
  int32_t in_stack_ffffffffffffffc4;
  int *in_stack_ffffffffffffffc8;
  Stream *in_stack_ffffffffffffffd0;
  
  std::__cxx11::wstring::wstring(local_40);
  Record::dataStream(in_RSI);
  Stream::read<int>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  Record::dataStream(in_RSI);
  Stream::read<short>(in_stack_ffffffffffffffd0,(short *)in_stack_ffffffffffffffc8,
                      in_stack_ffffffffffffffc4);
  Record::dataStream(in_RSI);
  Record::borders(in_RSI);
  loadString_abi_cxx11_(in_stack_000000d8,in_stack_000000d0,in_stack_000000cc,in_stack_000000c8);
  this = local_70;
  std::__cxx11::wstring::operator=(local_40,this);
  std::__cxx11::wstring::~wstring(this);
  uVar2 = 0;
  SVar1 = BoundSheet::convertSheetType(0);
  BoundSheet::BoundSheet
            ((BoundSheet *)CONCAT44(SVar1,uVar2),(int32_t)((ulong)this >> 0x20),(SheetType)this,
             (wstring *)0x134dba);
  std::__cxx11::wstring::~wstring(local_40);
  return in_RDI;
}

Assistant:

inline BoundSheet
Parser::parseBoundSheet( Record & record, BOF::BiffVersion ver )
{
	int32_t pos = 0;
	int16_t sheetType = 0;
	std::wstring sheetName;

	record.dataStream().read( pos, 4 );

	record.dataStream().read( sheetType, 2 );

	sheetName = loadString( record.dataStream(), record.borders(), 1, ver );

	return BoundSheet( pos,
		BoundSheet::convertSheetType( sheetType ),
		sheetName );
}